

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Status __thiscall
google::protobuf::DescriptorPool::SetFeatureSetDefaults
          (DescriptorPool *this,FeatureSetDefaults *spec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Edition EVar2;
  void *pvVar3;
  undefined8 uVar4;
  Rep *pRVar5;
  void **ppvVar6;
  FeatureSetDefaults *this_00;
  FeatureSetDefaults *in_RDX;
  Edition EVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  AlphaNum *in_R8;
  pointer __p;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar10;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string local_120;
  undefined1 local_100 [48];
  undefined1 local_d0 [48];
  StringifySink local_a0;
  __uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  local_80;
  char *local_78;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  undefined8 local_60;
  char *local_58;
  char *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  undefined8 local_40;
  char *local_38;
  
  if (*(char *)&spec[1].field_0 == '\x01') {
    message._M_str = (char *)0x49;
    message._M_len = (size_t)this;
    absl::lts_20250127::FailedPreconditionError(message);
  }
  else {
    EVar7 = (in_RDX->field_0)._impl_.minimum_edition_;
    if ((in_RDX->field_0)._impl_.maximum_edition_ < (int)EVar7) {
      local_100._16_8_ = 0;
      local_100._24_8_ = 0;
      local_100._8_8_ = (char *)0x0;
      local_100._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_100 + 0x10);
      AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                ((StringifySink *)local_100,EVar7);
      uVar4 = local_100._8_8_;
      uVar8 = local_100._0_8_;
      local_120.field_2._M_allocated_capacity = 0;
      local_120.field_2._8_8_ = 0;
      local_120._M_string_length = 0;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                ((StringifySink *)&local_120,(in_RDX->field_0)._impl_.maximum_edition_);
      local_80._M_t.
      super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
           (tuple<google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
            )(_Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
              )0x16;
      local_78 = "Invalid edition range ";
      local_70 = (char *)uVar4;
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar8;
      local_60 = 4;
      local_58 = " to ";
      local_50 = (char *)local_120._M_string_length;
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_120._M_dataplus._M_p;
      local_40 = 1;
      local_38 = ".";
      pieces._M_len = local_120._M_string_length;
      pieces._M_array = (iterator)0x5;
      absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                ((string *)local_d0,(strings_internal *)&local_80,pieces);
      message_00._M_str = (char *)local_d0._8_8_;
      message_00._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message_00);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      uVar8 = local_100._16_8_;
      _Var9._M_p = (pointer)local_100._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_100 + 0x10)) {
LAB_0016138f:
        operator_delete(_Var9._M_p,uVar8 + 1);
      }
    }
    else {
      this_01 = &(in_RDX->field_0)._impl_.defaults_;
      pRVar10 = this_01;
      if ((undefined1  [40])((undefined1  [40])in_RDX->field_0 & (undefined1  [40])0x1) !=
          (undefined1  [40])0x0) {
        pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
        pRVar10 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *
                  )pRVar5->elements;
        if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
          this_01 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                     *)pRVar5->elements;
        }
      }
      ppvVar6 = &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                *(int *)((long)&in_RDX->field_0 + 0x10);
      if (pRVar10 !=
          (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)ppvVar6
         ) {
        EVar7 = EDITION_UNKNOWN;
        do {
          pvVar3 = (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          EVar2 = *(Edition *)((long)pvVar3 + 0x28);
          if (EVar2 == EDITION_UNKNOWN) {
            local_80._M_t.
            super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
            .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
                 (tuple<google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                  )(_Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                    )0x10;
            local_78 = "Invalid edition ";
            paVar1 = &local_a0.buffer_.field_2;
            local_a0.buffer_.field_2._M_allocated_capacity = 0;
            local_a0.buffer_.field_2._8_8_ = 0;
            local_a0.buffer_._M_string_length = 0;
            local_a0.buffer_._M_dataplus._M_p = (pointer)paVar1;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                      (&local_a0,EDITION_UNKNOWN);
            local_d0._0_8_ = local_a0.buffer_._M_string_length;
            local_d0._8_8_ = local_a0.buffer_._M_dataplus._M_p;
            local_100._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xb;
            local_100._8_8_ = " specified.";
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_120,(lts_20250127 *)&local_80,(AlphaNum *)local_d0,
                       (AlphaNum *)local_100,in_R8);
            message_01._M_str = (char *)local_120._M_string_length;
            message_01._M_len = (size_t)this;
            absl::lts_20250127::InvalidArgumentError(message_01);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            uVar8 = local_a0.buffer_.field_2._M_allocated_capacity;
            _Var9._M_p = local_a0.buffer_._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.buffer_._M_dataplus._M_p == paVar1) {
              return (Status)(uintptr_t)this;
            }
            goto LAB_0016138f;
          }
          if ((int)EVar2 <= (int)EVar7) {
            local_100._16_8_ = 0;
            local_100._24_8_ = 0;
            local_100._8_8_ = (char *)0x0;
            local_100._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_100 + 0x10);
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                      ((StringifySink *)local_100,EVar7);
            uVar4 = local_100._8_8_;
            uVar8 = local_100._0_8_;
            local_120.field_2._M_allocated_capacity = 0;
            local_120.field_2._8_8_ = 0;
            local_120._M_string_length = 0;
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                      ((StringifySink *)&local_120,*(Edition *)((long)pvVar3 + 0x28));
            local_80._M_t.
            super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
            .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
                 (tuple<google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                  )(_Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                    )0x3b;
            local_78 = "Feature set defaults are not strictly increasing.  Edition ";
            local_70 = (char *)uVar4;
            local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)uVar8;
            local_60 = 0x25;
            local_58 = " is greater than or equal to edition ";
            local_50 = (char *)local_120._M_string_length;
            local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_120._M_dataplus._M_p;
            local_40 = 1;
            local_38 = ".";
            pieces_00._M_len = local_120._M_string_length;
            pieces_00._M_array = (iterator)0x5;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      ((string *)local_d0,(strings_internal *)&local_80,pieces_00);
            message_02._M_str = (char *)local_d0._8_8_;
            message_02._M_len = (size_t)this;
            absl::lts_20250127::InvalidArgumentError(message_02);
            if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
              operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            uVar8 = local_100._16_8_;
            _Var9._M_p = (pointer)local_100._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_100 + 0x10)) {
              return (Status)(uintptr_t)this;
            }
            goto LAB_0016138f;
          }
          pRVar10 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                     *)&(pRVar10->super_RepeatedPtrFieldBase).current_size_;
          EVar7 = EVar2;
        } while (pRVar10 !=
                 (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                 ppvVar6);
      }
      this_00 = (FeatureSetDefaults *)operator_new(0x38);
      FeatureSetDefaults::FeatureSetDefaults(this_00,(Arena *)0x0,in_RDX);
      local_80._M_t.
      super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
           (tuple<google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
            )(_Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
              )0x0;
      std::
      __uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      ::reset((__uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
               *)(spec + 2),this_00);
      std::
      unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      ::~unique_ptr((unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     *)&local_80);
      (this->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i = 1;
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status DescriptorPool::SetFeatureSetDefaults(FeatureSetDefaults spec) {
  if (build_started_) {
    return absl::FailedPreconditionError(
        "Feature set defaults can't be changed once the pool has started "
        "building.");
  }
  if (spec.minimum_edition() > spec.maximum_edition()) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid edition range ", spec.minimum_edition(), " to ",
                     spec.maximum_edition(), "."));
  }
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : spec.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return absl::InvalidArgumentError(absl::StrCat(
          "Invalid edition ", edition_default.edition(), " specified."));
    }
    if (edition_default.edition() <= prev_edition) {
      return absl::InvalidArgumentError(absl::StrCat(
          "Feature set defaults are not strictly increasing.  Edition ",
          prev_edition, " is greater than or equal to edition ",
          edition_default.edition(), "."));
    }
    prev_edition = edition_default.edition();
  }
  feature_set_defaults_spec_ =
      absl::make_unique<FeatureSetDefaults>(std::move(spec));
  return absl::OkStatus();
}